

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leaf.cpp
# Opt level: O3

bool duckdb::Leaf::DeprecatedGetRowIds
               (ART *art,Node *node,unsafe_vector<row_t> *row_ids,idx_t max_count)

{
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var1;
  iterator __position;
  type paVar2;
  iterator iVar3;
  pointer this;
  data_ptr_t pdVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  long lVar8;
  byte *pbVar9;
  byte *__args;
  ulong local_38;
  
  uVar5 = (node->super_IndexPointer).data;
  bVar7 = true;
  if (uVar5 >> 0x38 != 0) {
    do {
      paVar2 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
               ::operator*(&art->allocators);
      _Var1._M_head_impl =
           paVar2->_M_elems[1].
           super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
           .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
      local_38 = uVar5 & 0xffffffff;
      iVar3 = ::std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&((_Var1._M_head_impl)->buffers)._M_h,&local_38);
      this = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)((long)iVar3.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                    ._M_cur + 0x10));
      pdVar4 = FixedSizeBuffer::Get(this,false);
      lVar8 = (ulong)((uint)(uVar5 >> 0x20) & 0xffffff) * (_Var1._M_head_impl)->segment_size;
      uVar5 = (ulong)pdVar4[(_Var1._M_head_impl)->bitmask_offset + lVar8];
      uVar6 = ((long)(row_ids->super_vector<long,_std::allocator<long>_>).
                     super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                     ._M_finish -
               (long)(row_ids->super_vector<long,_std::allocator<long>_>).
                     super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                     ._M_start >> 3) + uVar5;
      bVar7 = uVar6 <= max_count;
      if (max_count < uVar6) {
        return false;
      }
      pbVar9 = pdVar4 + (_Var1._M_head_impl)->bitmask_offset + lVar8;
      if (pdVar4[(_Var1._M_head_impl)->bitmask_offset + lVar8] != 0) {
        uVar6 = 0;
        __args = pbVar9;
        do {
          __args = __args + 8;
          __position._M_current =
               (row_ids->super_vector<long,_std::allocator<long>_>).
               super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
               _M_finish;
          if (__position._M_current ==
              (row_ids->super_vector<long,_std::allocator<long>_>).
              super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            ::std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                      ((vector<long,std::allocator<long>> *)row_ids,__position,(long *)__args);
            uVar5 = (ulong)*pbVar9;
          }
          else {
            *__position._M_current = *(long *)__args;
            (row_ids->super_vector<long,_std::allocator<long>_>).
            super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
            _M_finish = __position._M_current + 1;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < uVar5);
      }
      uVar5 = *(ulong *)(pbVar9 + 0x28);
    } while (0xffffffffffffff < uVar5);
  }
  return bVar7;
}

Assistant:

bool Leaf::DeprecatedGetRowIds(ART &art, const Node &node, unsafe_vector<row_t> &row_ids, const idx_t max_count) {
	D_ASSERT(node.GetType() == LEAF);

	reference<const Node> ref(node);
	while (ref.get().HasMetadata()) {

		auto &leaf = Node::Ref<const Leaf>(art, ref, LEAF);
		if (row_ids.size() + leaf.count > max_count) {
			return false;
		}
		for (uint8_t i = 0; i < leaf.count; i++) {
			row_ids.push_back(leaf.row_ids[i]);
		}
		ref = leaf.ptr;
	}
	return true;
}